

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDConstructGridGlobal.hpp
# Opt level: O1

forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> __thiscall
TasGrid::readNodeDataList<TasGrid::IO::mode_ascii_type>
          (TasGrid *this,istream *is,size_t num_dimensions,size_t num_outputs)

{
  unsigned_long *puVar1;
  _Fwd_list_node_base *__to;
  int iVar2;
  int v;
  vector<int,_std::allocator<int>_> local_68;
  vector<double,_std::allocator<double>_> local_50;
  istream *local_38;
  
  *(undefined8 *)this = 0;
  local_38 = (istream *)num_outputs;
  ::std::istream::operator>>((istream *)is,(int *)&local_68);
  if (0 < (int)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start) {
    iVar2 = (int)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
    do {
      IO::readVector<TasGrid::IO::mode_ascii_type,int,unsigned_long>
                (&local_68,(IO *)is,(istream *)num_dimensions,num_outputs);
      IO::readVector<TasGrid::IO::mode_ascii_type,double,unsigned_long>
                (&local_50,(IO *)is,local_38,num_outputs);
      puVar1 = (unsigned_long *)operator_new(0x38);
      *puVar1 = 0;
      puVar1[1] = (unsigned_long)
                  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      puVar1[2] = (unsigned_long)
                  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      puVar1[3] = (unsigned_long)
                  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      puVar1[4] = (unsigned_long)
                  local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
      puVar1[5] = (unsigned_long)
                  local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      puVar1[6] = (unsigned_long)
                  local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      num_outputs = *(size_t *)this;
      *puVar1 = num_outputs;
      *(unsigned_long **)this = puVar1;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return (_Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>)
         (_Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>)this;
}

Assistant:

std::forward_list<NodeData> readNodeDataList(std::istream &is, size_t num_dimensions, size_t num_outputs){
    std::forward_list<NodeData> data;
    int num_nodes = IO::readNumber<iomode, int>(is);

    for(int i=0; i<num_nodes; i++){
        data.emplace_front(NodeData{
                            IO::readVector<iomode, int>(is, num_dimensions), // point
                            IO::readVector<iomode, double>(is, num_outputs)  // value
                           });
    }

    return data;
}